

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  uint *puVar4;
  ImGuiContext *pIVar5;
  ImGuiID IVar6;
  int iVar7;
  uint *__dest;
  int iVar8;
  ImGuiContext *ctx;
  long lVar9;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  __dest = (pIVar3->IDStack).Data;
  iVar2 = (pIVar3->IDStack).Size;
  lVar9 = (long)iVar2;
  if (str_id_end != (char *)0x0) {
    str_id_end = str_id_end + -(long)str_id_begin;
  }
  IVar6 = ImHashStr(str_id_begin,(size_t)str_id_end,__dest[lVar9 + -1]);
  if (iVar2 == (pIVar3->IDStack).Capacity) {
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    iVar8 = iVar2 + 1;
    if (iVar2 + 1 < iVar7) {
      iVar8 = iVar7;
    }
    piVar1 = &(pIVar5->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
    puVar4 = (pIVar3->IDStack).Data;
    if (puVar4 != (uint *)0x0) {
      memcpy(__dest,puVar4,(long)(pIVar3->IDStack).Size << 2);
      puVar4 = (pIVar3->IDStack).Data;
      if ((puVar4 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
    }
    (pIVar3->IDStack).Data = __dest;
    (pIVar3->IDStack).Capacity = iVar8;
    lVar9 = (long)(pIVar3->IDStack).Size;
  }
  __dest[lVar9] = IVar6;
  (pIVar3->IDStack).Size = (pIVar3->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(str_id_begin, str_id_end);
    window->IDStack.push_back(id);
}